

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Gridded_Data_PDU::SetPDUNumberAndTotal(Gridded_Data_PDU *this,KUINT16 Num,KUINT16 Total)

{
  KException *this_00;
  KString local_40;
  
  if (Num <= Total) {
    this->m_ui16PDUNum = Num;
    this->m_ui16PDUTotal = Total;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SetPDUNumberAndTotal","");
  KException::KException<char_const*>
            (this_00,&local_40,8,"PDU Number can not be greater than PDU Total");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Gridded_Data_PDU::SetPDUNumberAndTotal(KUINT16 Num, KUINT16 Total) noexcept(false)
{
    if( Num > Total )throw KException( __FUNCTION__, INVALID_DATA, "PDU Number can not be greater than PDU Total" );
    m_ui16PDUNum = Num;
    m_ui16PDUTotal = Total;
}